

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixedEnvelopes.cpp
# Opt level: O0

double __thiscall
IsoSpec::FixedEnvelope::WassersteinDistance(FixedEnvelope *this,FixedEnvelope *other)

{
  logic_error *this_00;
  long in_RSI;
  int __x;
  long in_RDI;
  long lVar1;
  bool bVar2;
  double dVar3;
  double dVar4;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double last_point;
  double acc_prob;
  size_t idx_other;
  size_t idx_this;
  double ret;
  FixedEnvelope *in_stack_ffffffffffffff80;
  double local_50;
  double local_48;
  ulong local_40;
  ulong local_38;
  double local_20;
  double local_8;
  
  local_20 = 0.0;
  dVar3 = get_total_prob(in_stack_ffffffffffffff80);
  dVar4 = get_total_prob(in_stack_ffffffffffffff80);
  if (dVar3 * 0.999 <= dVar4) {
    dVar3 = get_total_prob(in_stack_ffffffffffffff80);
    dVar4 = get_total_prob(in_stack_ffffffffffffff80);
    if (dVar3 <= dVar4 * 1.001) {
      if ((*(long *)(in_RDI + 0x20) == 0) || (*(long *)(in_RSI + 0x20) == 0)) {
        local_8 = 0.0;
      }
      else {
        sort_by_mass(in_stack_ffffffffffffff80);
        lVar1 = in_RSI;
        sort_by_mass(in_stack_ffffffffffffff80);
        local_38 = 0;
        local_40 = 0;
        local_50 = 0.0;
        while( true ) {
          bVar2 = false;
          if (local_38 < *(ulong *)(in_RDI + 0x20)) {
            bVar2 = local_40 < *(ulong *)(in_RSI + 0x20);
          }
          __x = (int)lVar1;
          if (!bVar2) break;
          if (*(double *)(*(long *)(in_RSI + 8) + local_40 * 8) <=
              *(double *)(*(long *)(in_RDI + 8) + local_38 * 8)) {
            dVar3 = *(double *)(*(long *)(in_RSI + 8) + local_40 * 8);
            std::abs(__x);
            dVar3 = (dVar3 - local_50) * extraout_XMM0_Qa_00;
            local_50 = *(double *)(*(long *)(in_RSI + 8) + local_40 * 8);
            local_40 = local_40 + 1;
          }
          else {
            local_50 = *(double *)(*(long *)(in_RDI + 8) + local_38 * 8) - local_50;
            std::abs(__x);
            dVar3 = local_50 * extraout_XMM0_Qa;
            local_50 = *(double *)(*(long *)(in_RDI + 8) + local_38 * 8);
            local_38 = local_38 + 1;
          }
          local_20 = dVar3 + local_20;
        }
        std::abs(__x);
        local_48 = extraout_XMM0_Qa_01;
        for (; local_38 < *(ulong *)(in_RDI + 0x20); local_38 = local_38 + 1) {
          local_20 = (*(double *)(*(long *)(in_RDI + 8) + local_38 * 8) - local_50) * local_48 +
                     local_20;
          local_48 = local_48 - *(double *)(*(long *)(in_RDI + 0x10) + local_38 * 8);
          local_50 = *(double *)(*(long *)(in_RDI + 8) + local_38 * 8);
        }
        for (; local_40 < *(ulong *)(in_RSI + 0x20); local_40 = local_40 + 1) {
          local_20 = (*(double *)(*(long *)(in_RSI + 8) + local_40 * 8) - local_50) * local_48 +
                     local_20;
          local_48 = local_48 - *(double *)(*(long *)(in_RSI + 0x10) + local_40 * 8);
          local_50 = *(double *)(*(long *)(in_RSI + 8) + local_40 * 8);
        }
        local_8 = local_20;
      }
      return local_8;
    }
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error
            (this_00,"Spectra must be normalized before computing Wasserstein Distance");
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

double FixedEnvelope::WassersteinDistance(FixedEnvelope& other)
{
    double ret = 0.0;
    if((get_total_prob()*0.999 > other.get_total_prob()) || (other.get_total_prob() > get_total_prob()*1.001))
        throw std::logic_error("Spectra must be normalized before computing Wasserstein Distance");

    if(_confs_no == 0 || other._confs_no == 0)
        return 0.0;

    sort_by_mass();
    other.sort_by_mass();

    size_t idx_this = 0;
    size_t idx_other = 0;

    double acc_prob = 0.0;
    double last_point = 0.0;


    while(idx_this < _confs_no && idx_other < other._confs_no)
    {
        if(_masses[idx_this] < other._masses[idx_other])
        {
            ret += (_masses[idx_this] - last_point) * std::abs(acc_prob);
            acc_prob += _probs[idx_this];
            last_point = _masses[idx_this];
            idx_this++;
        }
        else
        {
            ret += (other._masses[idx_other] - last_point) * std::abs(acc_prob);
            acc_prob -= other._probs[idx_other];
            last_point = other._masses[idx_other];
            idx_other++;
        }
    }

    acc_prob = std::abs(acc_prob);

    while(idx_this < _confs_no)
    {
        ret += (_masses[idx_this] - last_point) * acc_prob;
        acc_prob -= _probs[idx_this];
        last_point = _masses[idx_this];
        idx_this++;
    }

    while(idx_other < other._confs_no)
    {
        ret += (other._masses[idx_other] - last_point) * acc_prob;
        acc_prob -= other._probs[idx_other];
        last_point = other._masses[idx_other];
        idx_other++;
    }

    return ret;
}